

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O2

bool __thiscall cmBinUtilsLinuxELFLinker::Prepare(cmBinUtilsLinuxELFLinker *this)

{
  cmBinUtilsLinuxELFGetRuntimeDependenciesTool *pcVar1;
  cmLDConfigTool *pcVar2;
  _func_int **pp_Var3;
  bool bVar4;
  string *psVar5;
  cmMakefile *this_00;
  ostream *poVar6;
  string ldConfigTool;
  string tool;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  ostream local_198;
  
  psVar5 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  std::__cxx11::string::string((string *)&local_1d8,(string *)psVar5);
  if (local_1d8._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_1d8);
  }
  bVar4 = std::operator==(&local_1d8,"objdump");
  if (bVar4) {
    std::
    make_unique<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)&local_198);
    pp_Var3 = local_198._vptr_basic_ostream;
    local_198._vptr_basic_ostream = (_func_int **)0x0;
    pcVar1 = (this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinuxELFGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_false>.
             _M_head_impl;
    (this->Tool)._M_t.
    super___uniq_ptr_impl<cmBinUtilsLinuxELFGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>_>
    .super__Head_base<0UL,_cmBinUtilsLinuxELFGetRuntimeDependenciesTool_*,_false>._M_head_impl =
         (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)pp_Var3;
    if (pcVar1 != (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)0x0) {
      (*pcVar1->_vptr_cmBinUtilsLinuxELFGetRuntimeDependenciesTool[1])();
      if ((cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)local_198._vptr_basic_ostream !=
          (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)0x0) {
        (**(code **)((long)*local_198._vptr_basic_ostream + 8))();
      }
    }
    this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmBinUtilsLinker).Archive);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"CMAKE_LDCONFIG_TOOL",(allocator<char> *)&local_1b8);
    psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_198);
    std::__cxx11::string::string((string *)&bStack_1f8,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_198);
    if (bStack_1f8._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&bStack_1f8);
    }
    bVar4 = std::operator==(&bStack_1f8,"ldconfig");
    if (bVar4) {
      std::make_unique<cmLDConfigLDConfigTool,cmRuntimeDependencyArchive*&>
                ((cmRuntimeDependencyArchive **)&local_198);
      pp_Var3 = local_198._vptr_basic_ostream;
      local_198._vptr_basic_ostream = (_func_int **)0x0;
      pcVar2 = (this->LDConfigTool)._M_t.
               super___uniq_ptr_impl<cmLDConfigTool,_std::default_delete<cmLDConfigTool>_>._M_t.
               super__Tuple_impl<0UL,_cmLDConfigTool_*,_std::default_delete<cmLDConfigTool>_>.
               super__Head_base<0UL,_cmLDConfigTool_*,_false>._M_head_impl;
      (this->LDConfigTool)._M_t.
      super___uniq_ptr_impl<cmLDConfigTool,_std::default_delete<cmLDConfigTool>_>._M_t.
      super__Tuple_impl<0UL,_cmLDConfigTool_*,_std::default_delete<cmLDConfigTool>_>.
      super__Head_base<0UL,_cmLDConfigTool_*,_false>._M_head_impl = (cmLDConfigTool *)pp_Var3;
      if (pcVar2 != (cmLDConfigTool *)0x0) {
        (*pcVar2->_vptr_cmLDConfigTool[1])();
        if ((cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)local_198._vptr_basic_ostream !=
            (cmBinUtilsLinuxELFGetRuntimeDependenciesTool *)0x0) {
          (**(code **)((long)*local_198._vptr_basic_ostream + 8))();
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar6 = std::operator<<(&local_198,"Invalid value for CMAKE_LDCONFIG_TOOL: ");
      std::operator<<(poVar6,(string *)&bStack_1f8);
      std::__cxx11::stringbuf::str();
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&bStack_1f8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    poVar6 = std::operator<<(&local_198,"Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ");
    std::operator<<(poVar6,(string *)&local_1d8);
    std::__cxx11::stringbuf::str();
    cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&bStack_1f8);
    std::__cxx11::string::~string((string *)&bStack_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  return bVar4;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    tool = "objdump";
  }
  if (tool == "objdump") {
    this->Tool =
      cm::make_unique<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  std::string ldConfigTool =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_TOOL");
  if (ldConfigTool.empty()) {
    ldConfigTool = "ldconfig";
  }
  if (ldConfigTool == "ldconfig") {
    this->LDConfigTool =
      cm::make_unique<cmLDConfigLDConfigTool>(this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_LDCONFIG_TOOL: " << ldConfigTool;
    this->SetError(e.str());
    return false;
  }

  return true;
}